

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

int check_flow_timeout(pcp_flow_t *f,void *timeout)

{
  int iVar1;
  undefined1 local_38 [8];
  timeval ctv;
  timeval *tout;
  void *timeout_local;
  pcp_flow_t *f_local;
  
  if (((f->timeout).tv_sec != 0) || ((f->timeout).tv_usec != 0)) {
    ctv.tv_usec = (__suseconds_t)timeout;
    gettimeofday((timeval *)local_38,(__timezone_ptr_t)0x0);
    iVar1 = timeval_comp(&f->timeout,(timeval *)local_38);
    if (iVar1 < 1) {
      if (f->state == pfs_wait_resp) {
        pcp_logger(PCP_LOGLVL_WARN,"Recv of PCP response for flow %d timed out.",
                   (ulong)f->key_bucket);
      }
      handle_flow_event(f,fev_flow_timedout,(pcp_recv_msg_t *)0x0);
    }
    if (((f->timeout).tv_sec != 0) || ((f->timeout).tv_usec != 0)) {
      timeval_subtract((timeval *)local_38,&f->timeout,(timeval *)local_38);
      if ((*(long *)ctv.tv_usec == 0) && (*(long *)(ctv.tv_usec + 8) == 0)) {
        *(undefined1 (*) [8])ctv.tv_usec = local_38;
        *(__time_t *)(ctv.tv_usec + 8) = ctv.tv_sec;
      }
      else {
        iVar1 = timeval_comp((timeval *)local_38,(timeval *)ctv.tv_usec);
        if (iVar1 < 0) {
          *(undefined1 (*) [8])ctv.tv_usec = local_38;
          *(__time_t *)(ctv.tv_usec + 8) = ctv.tv_sec;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int check_flow_timeout(pcp_flow_t *f, void *timeout) {
    struct timeval *tout = timeout;
    struct timeval ctv;

    if ((f->timeout.tv_sec == 0) && (f->timeout.tv_usec == 0)) {
        return 0;
    }

    gettimeofday(&ctv, NULL);
    if (timeval_comp(&f->timeout, &ctv) <= 0) {
        // timed out
        if (f->state == pfs_wait_resp) {
            PCP_LOG(PCP_LOGLVL_WARN,
                    "Recv of PCP response for flow %d timed out.",
                    f->key_bucket);
        }
        handle_flow_event(f, fev_flow_timedout, NULL);
    }

    if ((f->timeout.tv_sec == 0) && (f->timeout.tv_usec == 0)) {
        return 0;
    }

    timeval_subtract(&ctv, &f->timeout, &ctv);

    if ((tout->tv_sec == 0) && (tout->tv_usec == 0)) {
        *tout = ctv;
        return 0;
    }

    if (timeval_comp(&ctv, tout) < 0) {
        *tout = ctv;
    }

    return 0;
}